

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O2

bool __thiscall cmCPackGenerator::IsSetToOff(cmCPackGenerator *this,string *op)

{
  bool bVar1;
  cmValue cVar2;
  string_view value;
  
  cVar2 = cmMakefile::GetDefinition(this->MakefileMap,op);
  if ((cVar2.Value != (string *)0x0) && ((cVar2.Value)->_M_string_length != 0)) {
    value._M_str = ((cVar2.Value)->_M_dataplus)._M_p;
    value._M_len = (cVar2.Value)->_M_string_length;
    bVar1 = cmValue::IsOff(value);
    return bVar1;
  }
  return false;
}

Assistant:

bool cmCPackGenerator::IsSetToOff(const std::string& op) const
{
  cmValue ret = this->MakefileMap->GetDefinition(op);
  if (cmNonempty(ret)) {
    return cmIsOff(*ret);
  }
  return false;
}